

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
resizeImpl<slang::IntervalMapDetails::Path::Entry>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,size_type newSize,
          Entry *val)

{
  uint32_t uVar1;
  uint32_t uVar2;
  pointer pEVar3;
  long lVar4;
  ulong uVar5;
  Entry temp;
  Entry local_18;
  
  uVar5 = this->len;
  lVar4 = newSize - uVar5;
  if (uVar5 <= newSize) {
    if (uVar5 <= newSize && lVar4 != 0) {
      if (this->cap < newSize) {
        local_18.node = val->node;
        local_18.size = val->size;
        local_18.offset = val->offset;
        resizeRealloc<slang::IntervalMapDetails::Path::Entry>(this,newSize,&local_18);
      }
      else {
        if (0 < lVar4) {
          pEVar3 = this->data_ + uVar5;
          uVar5 = lVar4 + 1;
          do {
            uVar1 = val->size;
            uVar2 = val->offset;
            pEVar3->node = val->node;
            pEVar3->size = uVar1;
            pEVar3->offset = uVar2;
            pEVar3 = pEVar3 + 1;
            uVar5 = uVar5 - 1;
          } while (1 < uVar5);
        }
        this->len = newSize;
      }
      return;
    }
  }
  else {
    this->len = newSize;
  }
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }